

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O0

bool ShaderParserAmalgamate
               (string *base_path,string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *watches,string *read_file_error,string *amalgamate)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  const_reference this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  string_type local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  string include;
  smatch include_match;
  regex include_regex;
  undefined1 local_298 [4];
  uint32_t current_char;
  string curr_buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  istream local_240 [8];
  ifstream file;
  string *amalgamate_local;
  string *read_file_error_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *watches_local;
  string *path_local;
  string *base_path_local;
  
  std::ifstream::ifstream(local_240);
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::open(local_240,uVar4,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(&local_270,"Unable read file at path ",path);
    std::__cxx11::string::operator=((string *)read_file_error,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    base_path_local._7_1_ = 0;
    curr_buffer.field_2._12_4_ = 1;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(watches,path);
    std::__cxx11::string::string((string *)local_298);
    do {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) {
        std::ifstream::close();
        base_path_local._7_1_ = 1;
        curr_buffer.field_2._12_4_ = 1;
        break;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,(string *)local_298);
      do {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_298);
        iVar3 = isspace((int)*pcVar5);
      } while (iVar3 != 0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&include_match._M_begin,
                 "#include\\s+\"([^\"]+)\"",0x10);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)((long)&include.field_2 + 8));
      bVar2 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)((long)&include.field_2 + 8),
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         &include_match._M_begin,0);
      if (bVar2) {
        std::operator+(&local_320,base_path,'/');
        this = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)((long)&include.field_2 + 8),1);
        std::__cxx11::sub_match::operator_cast_to_string(&local_340,(sub_match *)this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,&local_320,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_320);
        ExtractBasePath(&local_360,(string *)local_300);
        bVar2 = ShaderParserAmalgamate
                          (&local_360,(string *)local_300,watches,read_file_error,amalgamate);
        std::__cxx11::string::~string((string *)&local_360);
        curr_buffer.field_2._M_local_buf[0xc] = ((bVar2 ^ 0xffU) & 1) != 0;
        if ((bool)curr_buffer.field_2._M_local_buf[0xc]) {
          base_path_local._7_1_ = 0;
        }
        curr_buffer.field_2._13_3_ = 0;
        std::__cxx11::string::~string((string *)local_300);
        if (curr_buffer.field_2._12_4_ == 0) goto LAB_001356b5;
      }
      else {
        std::operator+(&local_380,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,'\n');
        std::__cxx11::string::operator+=((string *)amalgamate,(string *)&local_380);
        std::__cxx11::string::~string((string *)&local_380);
LAB_001356b5:
        curr_buffer.field_2._12_4_ = 0;
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)((long)&include.field_2 + 8));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&include_match._M_begin);
    } while (curr_buffer.field_2._12_4_ == 0);
    std::__cxx11::string::~string((string *)local_298);
  }
  std::ifstream::~ifstream(local_240);
  return (bool)(base_path_local._7_1_ & 1);
}

Assistant:

bool ShaderParserAmalgamate(const std::string& base_path, const std::string& path, std::vector<std::string>& watches, std::string& read_file_error, std::string& amalgamate) {
    std::ifstream file;

    file.open(path.c_str());

    if (!file.is_open()) {
        read_file_error = "Unable read file at path " + path;
        return false;
    }

    watches.push_back(path);

    std::string curr_buffer;
    while (!file.eof()) {
        getline(file, curr_buffer);
        uint32_t current_char = 0;

        while (isspace(curr_buffer[current_char])) {
            ++current_char;
        }

        std::regex include_regex("#include\\s+\"([^\"]+)\"");
        std::smatch include_match;

        if (std::regex_search(curr_buffer, include_match, include_regex)) {
            std::string include = base_path + PATH_DELIMITER + std::string(include_match[1]);

            if (!ShaderParserAmalgamate(ExtractBasePath(include), include, watches, read_file_error, amalgamate)) {
                return false;
            }
        } else {
            amalgamate += curr_buffer + '\n';
        }
    }

    file.close();

    return true;
}